

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::BitmapImage::BitmapImage(BitmapImage *this,size_t w,size_t h)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t h_local;
  size_t w_local;
  BitmapImage *this_local;
  
  this->width = w;
  this->height = h;
  sVar1 = byte_count_for_bit_count(this->width);
  this->row_bytes = sVar1;
  sVar1 = get_data_size(this);
  puVar2 = (uint8_t *)operator_new__(sVar1);
  this->data = puVar2;
  puVar2 = this->data;
  sVar1 = get_data_size(this);
  memset(puVar2,0,sVar1);
  return;
}

Assistant:

BitmapImage::BitmapImage(size_t w, size_t h)
    : width(w),
      height(h),
      row_bytes(byte_count_for_bit_count(this->width)),
      data(new uint8_t[this->get_data_size()]) {
  memset(this->data, 0, this->get_data_size());
}